

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O1

adios2_error
adios2_inquire_all_attributes(adios2_attribute ***attributes,size_t *size,adios2_io *io)

{
  _Rb_tree_node_base *__k;
  size_t __nmemb;
  adios2_io *paVar1;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this;
  const_iterator cVar2;
  Attribute *pAVar3;
  _Rb_tree_node_base *p_Var4;
  AttrMap *__range2;
  adios2_attribute **ppaVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  adios2_io *local_280;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_278;
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  adios2_attribute **local_250;
  adios2_attribute ***local_248;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  string local_210;
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,"for adios2_io, in call to adios2_inquire_all_attributes","");
  adios2::helper::CheckForNullptr<adios2_io>(io,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  this = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *)adios2::core::IO::GetAttributes_abi_cxx11_();
  __nmemb = *(size_t *)(this + 0x18);
  *size = __nmemb;
  local_250 = (adios2_attribute **)calloc(__nmemb,8);
  local_240._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_240._M_impl.super__Rb_tree_header._M_header;
  local_240._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_240._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_240._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var8 = this + 0x10;
  local_240._M_impl.super__Rb_tree_header._M_header._M_right =
       local_240._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var8 = *(_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    **)p_Var8,
        p_Var8 != (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)0x0) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_240,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var8 + 8));
  }
  ppaVar5 = local_250;
  p_Var4 = local_240._M_impl.super__Rb_tree_header._M_header._M_left;
  local_280 = io;
  p_Var8 = this;
  local_248 = attributes;
  if ((_Rb_tree_header *)local_240._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_240._M_impl.super__Rb_tree_header) {
    do {
      local_278 = p_Var8;
      __k = p_Var4 + 1;
      cVar2 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(this,(key_type *)__k);
      paVar1 = local_280;
      switch(*(undefined4 *)
              (*(long *)((long)cVar2.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
                               ._M_cur + 0x28) + 0x28)) {
      case 1:
        local_2a0[0] = local_290;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
        local_270[0] = local_260;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"/","");
        pAVar3 = adios2::core::IO::InquireAttribute<signed_char>
                           (local_280,__k,local_2a0,(string *)local_270);
        if (local_270[0] != local_260) {
          operator_delete(local_270[0]);
        }
        if (local_2a0[0] != local_290) {
LAB_0011ae60:
          operator_delete(local_2a0[0]);
        }
        break;
      case 2:
        local_2a0[0] = local_290;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
        puVar6 = local_80;
        local_90[0] = puVar6;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"/","");
        pAVar3 = adios2::core::IO::InquireAttribute<short>(paVar1,__k,local_2a0,(string *)local_90);
        puVar7 = local_90[0];
        goto LAB_0011ac62;
      case 3:
        local_2a0[0] = local_290;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"/","");
        pAVar3 = adios2::core::IO::InquireAttribute<int>(paVar1,__k,local_2a0,(string *)local_b0);
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0]);
        }
        this = local_278;
        if (local_2a0[0] != local_290) {
          operator_delete(local_2a0[0]);
          this = local_278;
        }
        break;
      case 4:
        local_2a0[0] = local_290;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
        puVar6 = local_c0;
        local_d0[0] = puVar6;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"/","");
        pAVar3 = adios2::core::IO::InquireAttribute<long>(paVar1,__k,local_2a0,(string *)local_d0);
        puVar7 = local_d0[0];
        goto LAB_0011ad03;
      case 5:
        local_2a0[0] = local_290;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
        local_f0[0] = local_e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"/","");
        pAVar3 = adios2::core::IO::InquireAttribute<unsigned_char>
                           (local_280,__k,local_2a0,(string *)local_f0);
        if (local_f0[0] != local_e0) {
          operator_delete(local_f0[0]);
        }
        this = local_278;
        if (local_2a0[0] != local_290) {
          operator_delete(local_2a0[0]);
          this = local_278;
        }
        break;
      case 6:
        local_2a0[0] = local_290;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
        puVar6 = local_100;
        local_110[0] = puVar6;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"/","");
        pAVar3 = adios2::core::IO::InquireAttribute<unsigned_short>
                           (paVar1,__k,local_2a0,(string *)local_110);
        puVar7 = local_110[0];
        goto LAB_0011ad03;
      case 7:
        local_2a0[0] = local_290;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
        local_130[0] = local_120;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"/","");
        pAVar3 = adios2::core::IO::InquireAttribute<unsigned_int>
                           (local_280,__k,local_2a0,(string *)local_130);
        if (local_130[0] != local_120) {
          operator_delete(local_130[0]);
        }
        if (local_2a0[0] != local_290) goto LAB_0011ae60;
        break;
      case 8:
        local_2a0[0] = local_290;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
        puVar6 = local_140;
        local_150[0] = puVar6;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"/","");
        pAVar3 = adios2::core::IO::InquireAttribute<unsigned_long>
                           (paVar1,__k,local_2a0,(string *)local_150);
        puVar7 = local_150[0];
        goto LAB_0011ad03;
      case 9:
        local_2a0[0] = local_290;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
        local_170[0] = local_160;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"/","");
        pAVar3 = adios2::core::IO::InquireAttribute<float>
                           (local_280,__k,local_2a0,(string *)local_170);
        if (local_170[0] != local_160) {
          operator_delete(local_170[0]);
        }
        if (local_2a0[0] != local_290) {
          operator_delete(local_2a0[0]);
        }
        break;
      case 10:
        local_2a0[0] = local_290;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
        puVar6 = local_180;
        local_190[0] = puVar6;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"/","");
        pAVar3 = adios2::core::IO::InquireAttribute<double>
                           (paVar1,__k,local_2a0,(string *)local_190);
        puVar7 = local_190[0];
LAB_0011ad03:
        if (puVar7 != puVar6) {
          operator_delete(puVar7);
        }
        this = local_278;
        if (local_2a0[0] != local_290) {
          operator_delete(local_2a0[0]);
          this = local_278;
        }
        break;
      case 0xb:
        local_2a0[0] = local_290;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
        local_1b0[0] = local_1a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"/","");
        pAVar3 = adios2::core::IO::InquireAttribute<long_double>
                           (local_280,__k,local_2a0,(string *)local_1b0);
        if (local_1b0[0] != local_1a0) {
          operator_delete(local_1b0[0]);
        }
        if (local_2a0[0] != local_290) {
          operator_delete(local_2a0[0]);
        }
        break;
      case 0xc:
        local_2a0[0] = local_290;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
        local_1d0[0] = local_1c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"/","");
        pAVar3 = adios2::core::IO::InquireAttribute<std::complex<float>>
                           (paVar1,__k,local_2a0,(string *)local_1d0);
        puVar6 = local_1d0[0];
        if (local_1d0[0] != local_1c0) {
LAB_0011a8c3:
          operator_delete(puVar6);
        }
        goto LAB_0011a8c8;
      case 0xd:
        local_2a0[0] = local_290;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
        local_1f0[0] = local_1e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"/","");
        pAVar3 = adios2::core::IO::InquireAttribute<std::complex<double>>
                           (paVar1,__k,local_2a0,(string *)local_1f0);
        puVar6 = local_1f0[0];
        if (local_1f0[0] != local_1e0) goto LAB_0011a8c3;
LAB_0011a8c8:
        this = local_278;
        if (local_2a0[0] != local_290) {
          operator_delete(local_2a0[0]);
          this = local_278;
        }
        break;
      case 0xe:
        local_2a0[0] = local_290;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"/","");
        pAVar3 = adios2::core::IO::InquireAttribute<std::__cxx11::string>
                           (local_280,__k,local_2a0,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if (local_2a0[0] != local_290) {
          operator_delete(local_2a0[0]);
        }
        break;
      case 0xf:
        local_2a0[0] = local_290;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
        puVar6 = local_60;
        local_70[0] = puVar6;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"/","");
        pAVar3 = adios2::core::IO::InquireAttribute<char>(paVar1,__k,local_2a0,(string *)local_70);
        puVar7 = local_70[0];
LAB_0011ac62:
        if (puVar7 != puVar6) {
          operator_delete(puVar7);
        }
        this = local_278;
        if (local_2a0[0] != local_290) {
          operator_delete(local_2a0[0]);
          this = local_278;
        }
        break;
      default:
        goto switchD_0011a761_default;
      }
      *ppaVar5 = (adios2_attribute *)pAVar3;
switchD_0011a761_default:
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      ppaVar5 = ppaVar5 + 1;
      p_Var8 = local_278;
    } while ((_Rb_tree_header *)p_Var4 != &local_240._M_impl.super__Rb_tree_header);
  }
  *local_248 = local_250;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_240);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_inquire_all_attributes(adios2_attribute ***attributes, size_t *size,
                                           adios2_io *io)
{
    try
    {
        adios2::helper::CheckForNullptr(io,
                                        "for adios2_io, in call to adios2_inquire_all_attributes");

        adios2::core::IO &ioCpp = *reinterpret_cast<adios2::core::IO *>(io);
        const auto &dataMap = ioCpp.GetAttributes();

        *size = dataMap.size();
        adios2_attribute **list = (adios2_attribute **)calloc(*size, sizeof(adios2_attribute *));

        // Sort the names so that we return the same order as the
        // C++, python APIs
        std::set<std::string> names;
        for (auto &it : dataMap)
            names.insert(it.first);

        size_t n = 0;
        for (auto &name : names)
        {
            auto it = dataMap.find(name);
            const adios2::DataType type(it->second->m_Type);
            adios2::core::AttributeBase *attribute = nullptr;

            if (type == adios2::DataType::Struct)
            {
                // not supported
            }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        attribute = ioCpp.InquireAttribute<T>(name);                                               \
        list[n] = reinterpret_cast<adios2_attribute *>(attribute);                                 \
    }
            ADIOS2_FOREACH_ATTRIBUTE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

            n++;
        }
        *attributes = list;
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_inquire_all_attributes"));
    }
}